

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

string * jwt::base::pad(string *__return_storage_ptr__,string *base,string *fill)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string padding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  switch((uint)base->_M_string_length & 3) {
  case 1:
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)(fill->_M_dataplus)._M_p);
  case 2:
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)(fill->_M_dataplus)._M_p);
  case 3:
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)(fill->_M_dataplus)._M_p);
  case 0:
    std::operator+(__return_storage_ptr__,base,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
}

Assistant:

static std::string pad(const std::string& base, const std::string& fill) {
			std::string padding;
			switch (base.size() % 4) {
				case 1:
					padding += fill;
					JWT_FALLTHROUGH;
				case 2:
					padding += fill;
					JWT_FALLTHROUGH;
				case 3:
					padding += fill;
					JWT_FALLTHROUGH;
				default:
					break;
			}

			return base + padding;
		}